

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.h
# Opt level: O0

_Bool dict_put(lzma_dict *dict,uint8_t byte)

{
  size_t sVar1;
  uint8_t byte_local;
  lzma_dict *dict_local;
  
  if (dict->pos == dict->limit) {
    dict_local._7_1_ = true;
  }
  else {
    sVar1 = dict->pos;
    dict->pos = sVar1 + 1;
    dict->buf[sVar1] = byte;
    if (dict->full < dict->pos) {
      dict->full = dict->pos;
    }
    dict_local._7_1_ = false;
  }
  return dict_local._7_1_;
}

Assistant:

static inline bool
dict_put(lzma_dict *dict, uint8_t byte)
{
	if (unlikely(dict->pos == dict->limit))
		return true;

	dict->buf[dict->pos++] = byte;

	if (dict->pos > dict->full)
		dict->full = dict->pos;

	return false;
}